

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

int runargs(lua_State *L,char **argv,int n)

{
  int iVar1;
  char *s;
  lua_State *L_00;
  int in_EDX;
  lua_State *in_RSI;
  char *cmd;
  char *filename;
  char *chunk;
  int i;
  char *in_stack_ffffffffffffffb8;
  lua_State *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int iVar2;
  
  iVar2 = 1;
  do {
    if (in_EDX <= iVar2) {
      return 0;
    }
    if (*(long *)(&in_RSI->nextgc + (long)iVar2 * 2) != 0) {
      L_00 = (lua_State *)
             (ulong)((int)*(char *)(*(long *)(&in_RSI->nextgc + (long)iVar2 * 2) + 1) - 0x4f);
      switch(L_00) {
      case (lua_State *)0x0:
        iVar1 = dojitopt(L_00,in_stack_ffffffffffffffb8);
        if (iVar1 != 0) {
          return 1;
        }
        break;
      default:
        break;
      case (lua_State *)0x13:
        iVar2 = dobytecode(in_stack_ffffffffffffffc8,(char **)L_00);
        return iVar2;
      case (lua_State *)0x16:
        s = (char *)(*(long *)(&in_RSI->nextgc + (long)iVar2 * 2) + 2);
        if (*s == '\0') {
          iVar2 = iVar2 + 1;
          s = *(char **)(&in_RSI->nextgc + (long)iVar2 * 2);
        }
        iVar1 = dostring((lua_State *)CONCAT44(in_EDX,iVar2),s,in_stack_ffffffffffffffd0);
        if (iVar1 != 0) {
          return 1;
        }
        break;
      case (lua_State *)0x1b:
        in_stack_ffffffffffffffc8 = (lua_State *)(*(long *)(&in_RSI->nextgc + (long)iVar2 * 2) + 2);
        if ((char)(in_stack_ffffffffffffffc8->nextgc).gcptr32 == '\0') {
          iVar2 = iVar2 + 1;
          in_stack_ffffffffffffffc8 = *(lua_State **)(&in_RSI->nextgc + (long)iVar2 * 2);
        }
        iVar1 = dojitcmd(in_RSI,(char *)CONCAT44(in_EDX,iVar2));
        if (iVar1 != 0) {
          return 1;
        }
        break;
      case (lua_State *)0x1d:
        in_stack_ffffffffffffffd0 = (char *)(*(long *)(&in_RSI->nextgc + (long)iVar2 * 2) + 2);
        if (*in_stack_ffffffffffffffd0 == '\0') {
          iVar2 = iVar2 + 1;
          in_stack_ffffffffffffffd0 = *(char **)(&in_RSI->nextgc + (long)iVar2 * 2);
        }
        iVar1 = dolibrary(L_00,in_stack_ffffffffffffffb8);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

static int runargs(lua_State *L, char **argv, int n)
{
  int i;
  for (i = 1; i < n; i++) {
    if (argv[i] == NULL) continue;
    lua_assert(argv[i][0] == '-');
    switch (argv[i][1]) {  /* option */
    case 'e': {
      const char *chunk = argv[i] + 2;
      if (*chunk == '\0') chunk = argv[++i];
      lua_assert(chunk != NULL);
      if (dostring(L, chunk, "=(command line)") != 0)
	return 1;
      break;
      }
    case 'l': {
      const char *filename = argv[i] + 2;
      if (*filename == '\0') filename = argv[++i];
      lua_assert(filename != NULL);
      if (dolibrary(L, filename))
	return 1;  /* stop if file fails */
      break;
      }
    case 'j': {  /* LuaJIT extension */
      const char *cmd = argv[i] + 2;
      if (*cmd == '\0') cmd = argv[++i];
      lua_assert(cmd != NULL);
      if (dojitcmd(L, cmd))
	return 1;
      break;
      }
    case 'O':  /* LuaJIT extension */
      if (dojitopt(L, argv[i] + 2))
	return 1;
      break;
    case 'b':  /* LuaJIT extension */
      return dobytecode(L, argv+i);
    default: break;
    }
  }
  return 0;
}